

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_bolelli_2018.h
# Opt level: O1

void __thiscall DRAG<RemSP>::SecondScan(DRAG<RemSP> *this)

{
  long lVar1;
  uint uVar2;
  Mat1i *pMVar3;
  Mat1b *pMVar4;
  long lVar5;
  long lVar6;
  uint *puVar7;
  uint *puVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  uint uVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  
  puVar7 = RemSP::P_;
  uVar10 = 1;
  if (1 < RemSP::length_) {
    uVar10 = 1;
    uVar16 = 1;
    do {
      if (puVar7[uVar16] < uVar16) {
        puVar7[uVar16] = puVar7[puVar7[uVar16]];
      }
      else {
        puVar7[uVar16] = uVar10;
        uVar10 = uVar10 + 1;
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 < RemSP::length_);
  }
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar10;
  puVar7 = RemSP::P_;
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  uVar10 = *(uint *)&pMVar3->field_0x8;
  uVar22 = uVar10 & 0xfffffffe;
  uVar2 = *(uint *)&pMVar3->field_0xc;
  uVar17 = (long)(int)uVar2 & 0xfffffffffffffffe;
  uVar16 = 0;
  iVar15 = (int)uVar17;
  if (0 < (int)uVar22) {
    pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    lVar20 = *(long *)&pMVar4->field_0x10;
    lVar5 = **(long **)&pMVar4->field_0x48;
    lVar6 = *(long *)&pMVar3->field_0x10;
    lVar26 = **(long **)&pMVar3->field_0x48;
    lVar24 = lVar6 + lVar26;
    lVar11 = lVar20 + 1 + lVar5;
    lVar21 = lVar20 + 1;
    uVar16 = 0;
    lVar12 = lVar6;
    do {
      puVar8 = RemSP::P_;
      lVar25 = lVar26 * uVar16 + lVar6;
      lVar1 = lVar25 + lVar26;
      if (iVar15 < 1) {
        uVar9 = 0;
      }
      else {
        uVar9 = 0;
        do {
          lVar23 = (long)*(int *)(lVar12 + uVar9 * 4);
          if (lVar23 < 1) {
            *(undefined8 *)(lVar12 + uVar9 * 4) = 0;
            uVar14 = uVar9 + 1;
            *(undefined4 *)(lVar24 + uVar9 * 4) = 0;
            uVar18 = 0;
          }
          else {
            uVar18 = puVar8[lVar23];
            uVar13 = uVar18;
            if (*(char *)(lVar21 + -1 + uVar9) == '\0') {
              uVar13 = 0;
            }
            *(uint *)(lVar12 + uVar9 * 4) = uVar13;
            uVar14 = uVar9 | 1;
            uVar13 = uVar18;
            if (*(char *)(lVar21 + uVar9) == '\0') {
              uVar13 = 0;
            }
            *(uint *)(lVar12 + 4 + uVar9 * 4) = uVar13;
            uVar13 = uVar18;
            if (*(char *)(lVar11 + -1 + uVar9) == '\0') {
              uVar13 = 0;
            }
            *(uint *)(lVar24 + uVar9 * 4) = uVar13;
            if (*(char *)(lVar11 + uVar9) == '\0') {
              uVar18 = 0;
            }
          }
          *(uint *)(lVar1 + uVar14 * 4) = uVar18;
          uVar9 = uVar9 + 2;
        } while ((long)uVar9 < (long)uVar17);
      }
      if ((uVar2 & 0x80000001) == 1) {
        lVar23 = (long)*(int *)(lVar25 + uVar9 * 4);
        if (lVar23 < 1) {
          *(undefined4 *)(lVar25 + uVar9 * 4) = 0;
          *(undefined4 *)(lVar1 + uVar9 * 4) = 0;
        }
        else {
          lVar19 = lVar5 * uVar16 + lVar20;
          uVar18 = puVar7[lVar23];
          uVar13 = uVar18;
          if (*(char *)(lVar19 + uVar9) == '\0') {
            uVar13 = 0;
          }
          *(uint *)(lVar25 + uVar9 * 4) = uVar13;
          if (*(char *)(lVar19 + lVar5 + uVar9) == '\0') {
            *(undefined4 *)(lVar1 + uVar9 * 4) = 0;
          }
          else {
            *(uint *)(lVar1 + uVar9 * 4) = uVar18;
          }
        }
      }
      uVar16 = uVar16 + 2;
      lVar24 = lVar24 + lVar26 * 2;
      lVar11 = lVar11 + lVar5 * 2;
      lVar21 = lVar21 + lVar5 * 2;
      lVar12 = lVar12 + lVar26 * 2;
    } while (uVar16 < uVar22);
    uVar16 = uVar16 & 0xffffffff;
  }
  puVar7 = RemSP::P_;
  if ((uVar10 & 0x80000001) == 1) {
    pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    lVar21 = *(long *)&pMVar4->field_0x10;
    lVar20 = **(long **)&pMVar4->field_0x48 * uVar16;
    lVar24 = *(long *)&pMVar3->field_0x10;
    lVar11 = uVar16 * **(long **)&pMVar3->field_0x48;
    if (iVar15 < 1) {
      uVar16 = 0;
    }
    else {
      lVar5 = lVar20 + lVar21;
      lVar6 = lVar11 + lVar24;
      uVar16 = 0;
      do {
        lVar26 = (long)*(int *)(lVar6 + uVar16 * 4);
        if (lVar26 < 1) {
          *(undefined8 *)(lVar6 + uVar16 * 4) = 0;
        }
        else {
          uVar10 = puVar7[lVar26];
          uVar22 = uVar10;
          if (*(char *)(lVar5 + uVar16) == '\0') {
            uVar22 = 0;
          }
          *(uint *)(lVar6 + uVar16 * 4) = uVar22;
          if (*(char *)(lVar5 + 1 + uVar16) == '\0') {
            *(undefined4 *)(lVar6 + 4 + uVar16 * 4) = 0;
          }
          else {
            *(uint *)(lVar6 + 4 + uVar16 * 4) = uVar10;
          }
        }
        uVar16 = uVar16 + 2;
      } while (uVar16 < ((long)(int)uVar2 & 0xfffffffeU));
    }
    if ((uVar2 & 0x80000001) == 1) {
      lVar24 = lVar24 + lVar11;
      lVar11 = (long)*(int *)(lVar24 + uVar16 * 4);
      uVar10 = 0;
      if ((0 < lVar11) && (uVar10 = 0, *(char *)(lVar21 + lVar20 + uVar16) != '\0')) {
        uVar10 = RemSP::P_[lVar11];
      }
      *(uint *)(lVar24 + uVar16 * 4) = uVar10;
    }
  }
  return;
}

Assistant:

void Dealloc()
    {
        LabelsSolver::Dealloc();
        // No free for img_labels_ because it is required at the end of the algorithm 
    }